

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_trainer.cpp
# Opt level: O1

bool __thiscall
Am_Gesture_Trainer::Add_Example
          (Am_Gesture_Trainer *this,Am_String *classname,Am_Feature_Vector *fv,bool unique)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_Gesture_Trainer_Data *pAVar3;
  Am_Wrapper *value;
  Gesture_Class *this_00;
  Am_String AStack_28;
  
  if (this->data == (Am_Gesture_Trainer_Data *)0x0) {
    pAVar3 = (Am_Gesture_Trainer_Data *)operator_new(0x30);
    Am_Gesture_Trainer_Data::Am_Gesture_Trainer_Data(pAVar3);
  }
  else {
    if (!unique) goto LAB_001a668e;
    iVar2 = (*(this->data->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])()
    ;
    pAVar3 = (Am_Gesture_Trainer_Data *)CONCAT44(extraout_var,iVar2);
  }
  this->data = pAVar3;
LAB_001a668e:
  pAVar3 = this->data;
  Am_String::Am_String(&AStack_28,classname);
  for (this_00 = pAVar3->head; this_00 != (Gesture_Class *)0x0; this_00 = this_00->next) {
    bVar1 = Am_String::operator==(&this_00->name,&AStack_28);
    if (bVar1) goto LAB_001a66c4;
  }
  this_00 = (Gesture_Class *)0x0;
LAB_001a66c4:
  Am_String::~Am_String(&AStack_28);
  if (this_00 != (Gesture_Class *)0x0) {
    value = Am_Feature_Vector::operator_cast_to_Am_Wrapper_(fv);
    Am_Value_List::Add(&this_00->examples,value,Am_TAIL,true);
    Am_Gesture_Classifier::operator=
              (&this->data->cached_classifier,(Am_Gesture_Classifier_Data *)0x0);
  }
  return this_00 != (Gesture_Class *)0x0;
}

Assistant:

bool
Am_Gesture_Trainer::Add_Example(Am_String classname, Am_Feature_Vector fv,
                                bool unique)
{
  if (!data)
    data = new Am_Gesture_Trainer_Data();
  else if (unique)
    data = (Am_Gesture_Trainer_Data *)data->Make_Unique();

  Am_Gesture_Trainer_Data::Gesture_Class *c = data->Find_Class(classname);
  if (!c)
    return false;

  c->examples.Add(fv);

  data->cached_classifier = nullptr;
  return true;
}